

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeVector.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMNodeVector::insertElementAt(DOMNodeVector *this,DOMNode *elem,XMLSize_t index)

{
  ulong uVar1;
  DOMNode **ppDVar2;
  ulong uVar3;
  
  if (index <= this->nextFreeSlot) {
    checkSpace(this);
    uVar1 = this->nextFreeSlot;
    for (uVar3 = uVar1; ppDVar2 = this->data, index < uVar3; uVar3 = uVar3 - 1) {
      ppDVar2[uVar3] = ppDVar2[uVar3 - 1];
    }
    ppDVar2[index] = elem;
    this->nextFreeSlot = uVar1 + 1;
    return;
  }
  __assert_fail("index <= nextFreeSlot",
                "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/dom/impl/DOMNodeVector.cpp"
                ,0x5d,"void xercesc_4_0::DOMNodeVector::insertElementAt(DOMNode *, XMLSize_t)");
}

Assistant:

void DOMNodeVector::insertElementAt(DOMNode *elem, XMLSize_t index) {

	assert(index <= nextFreeSlot);

	checkSpace();
	for (XMLSize_t i=nextFreeSlot; i>index; --i) {
		data[i] = data[i-1];
	}
	data[index] = elem;
	++nextFreeSlot;

}